

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getInjectionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<helics::route_id,_helics::ActionMessage> *ppVar2;
  FederateState *this_00;
  InputInfo *pIVar3;
  string *psVar4;
  BaseType in_ESI;
  CommonCore *in_RDI;
  InputInfo *inpInfo;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *handleInfo;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffd8;
  InterfaceHandle handle_00;
  LocalFederateId federateID;
  undefined1 *local_8;
  
  federateID.fid = in_ESI;
  ppVar2 = getHandleInfo((CommonCore *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                         ,(InterfaceHandle)(BaseType)((ulong)in_RDI >> 0x20));
  if (ppVar2 != (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    cVar1 = (char)(ppVar2->second).messageID;
    if (cVar1 == 'e') {
      return (string *)&(ppVar2->second).Te;
    }
    if (cVar1 == 'f') {
      return *(string **)((ppVar2->second).payload.buffer._M_elems + 0x28);
    }
    if (cVar1 != 'i') {
      local_8 = gEmptyString_abi_cxx11_;
      return (string *)local_8;
    }
    this_00 = getFederateAt(in_RDI,federateID);
    handle_00.hid = (BaseType)((ulong)ppVar2 >> 0x20);
    FederateState::interfaces(this_00);
    pIVar3 = InterfaceInfo::getInput
                       ((InterfaceInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),handle_00);
    if (pIVar3 != (InputInfo *)0x0) {
      psVar4 = InputInfo::getInjectionType_abi_cxx11_((InputInfo *)this);
      return psVar4;
    }
  }
  local_8 = gEmptyString_abi_cxx11_;
  return (string *)local_8;
}

Assistant:

const std::string& CommonCore::getInjectionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionType();
                }
                break;
            }
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_in;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}